

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG>::SortDescending
          (BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *this,
          vector<double,_std::allocator<double>_> *values)

{
  value_type vVar1;
  allocator_type *__a;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RSI;
  Index i;
  vector<double,_std::allocator<double>_> *in_stack_00000038;
  vector<double,_std::allocator<double>_> valuesDescending;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *in_stack_ffffffffffffffb0;
  undefined1 *__n;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 local_29;
  vector<double,_std::allocator<double>_> local_28;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_10 = in_RSI;
  SortAscending(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  __a = (allocator_type *)std::vector<double,_std::allocator<double>_>::size(local_10);
  __n = &local_29;
  std::allocator<double>::allocator((allocator<double> *)0x14c6eb);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(size_type)__n,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x14c70b);
  uVar5 = 0;
  while( true ) {
    uVar2 = (ulong)uVar5;
    sVar3 = std::vector<double,_std::allocator<double>_>::size(local_10);
    if (uVar2 == sVar3) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(ulong)uVar5);
    vVar1 = *pvVar4;
    sVar3 = std::vector<double,_std::allocator<double>_>::size(local_10);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_28,(sVar3 - 1) - (ulong)uVar5);
    *pvVar4 = vVar1;
    uVar5 = uVar5 + 1;
  }
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             valuesDescending.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,in_stack_00000038);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__a);
  return;
}

Assistant:

void SortDescending(std::vector<double> &values) const{
    SortAscending(values);
    
    // invert the sorting
    std::vector<double> valuesDescending(values.size());
    for(Index i=0;i!=values.size();++i)
        valuesDescending[values.size()-1-i]=values[i];
    values=valuesDescending;
}